

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O0

QString * QSysInfo::machineHostName(void)

{
  long lVar1;
  int iVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  utsname u;
  QString *data;
  QByteArrayView *in_stack_fffffffffffffe60;
  undefined1 local_18e [94];
  QByteArrayView in_stack_fffffffffffffed0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  data = in_RDI;
  memset(local_18e,0xaa,0x186);
  iVar2 = uname((utsname *)local_18e);
  if (iVar2 == 0) {
    QByteArrayView::QByteArrayView<65ul>(in_stack_fffffffffffffe60,(char (*) [65])data);
    QString::fromLocal8Bit(in_stack_fffffffffffffed0);
  }
  else {
    QString::QString((QString *)0x25b2d1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QSysInfo::machineHostName()
{
    // the hostname can change, so we can't cache it
#if defined(Q_OS_LINUX)
    // gethostname(3) on Linux just calls uname(2), so do it ourselves
    // and avoid a memcpy
    struct utsname u;
    if (uname(&u) == 0)
        return QString::fromLocal8Bit(u.nodename);
    return QString();
#else
#  ifdef Q_OS_WIN
    // Important: QtNetwork depends on machineHostName() initializing ws2_32.dll
    winsockInit();
    QString hostName;
    hostName.resize(512);
    unsigned long len = hostName.size();
    BOOL res = GetComputerNameEx(ComputerNameDnsHostname,
                                 reinterpret_cast<wchar_t *>(hostName.data()), &len);
    if (!res && len > 512) {
        hostName.resize(len - 1);
        GetComputerNameEx(ComputerNameDnsHostname, reinterpret_cast<wchar_t *>(hostName.data()),
                          &len);
    }
    hostName.truncate(len);
    return hostName;
#  else // !Q_OS_WIN

    char hostName[512];
    if (gethostname(hostName, sizeof(hostName)) == -1)
        return QString();
    hostName[sizeof(hostName) - 1] = '\0';
    return QString::fromLocal8Bit(hostName);
#  endif
#endif
}